

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MANU.cpp
# Opt level: O0

int local_time(void)

{
  tm *ptVar1;
  tm *local;
  time_t t;
  int tt;
  
  time((time_t *)&local);
  ptVar1 = localtime((time_t *)&local);
  return (ptVar1->tm_year + 0x76c) * 10000 + (ptVar1->tm_mon + 1) * 100 + ptVar1->tm_mday;
}

Assistant:

int local_time() {
    int tt;
    time_t t;
    struct tm *local;
    time(&t);
    local = localtime(&t);
    tt = (local->tm_year + 1900) * 10000 + (local->tm_mon + 1)
                                           * 100 + (local->tm_mday);
    return tt;
}